

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

void __thiscall cmMakefile::LogUnused(cmMakefile *this,char *reason,string *name)

{
  size_type sVar1;
  bool bVar2;
  bool bVar3;
  char *pcVar4;
  size_t sVar5;
  ostream *poVar6;
  string path;
  ostringstream msg;
  undefined1 auStack_218 [14];
  allocator local_20a;
  allocator local_209;
  string local_208;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [32];
  _Alloc_hider local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178 [4];
  ios_base local_138 [264];
  
  if (this->WarnUnused != true) {
    return;
  }
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  local_1e8._M_string_length = 0;
  local_1e8.field_2._M_local_buf[0] = '\0';
  if ((this->ExecutionStatusStack).
      super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->ExecutionStatusStack).
      super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    cmStateSnapshot::GetDirectory((cmStateDirectory *)local_1a8,&this->StateSnapshot);
    pcVar4 = cmStateDirectory::GetCurrentSource((cmStateDirectory *)local_1a8);
    sVar1 = local_1e8._M_string_length;
    strlen(pcVar4);
    std::__cxx11::string::_M_replace((ulong)&local_1e8,0,(char *)sVar1,(ulong)pcVar4);
    std::__cxx11::string::append((char *)&local_1e8);
  }
  else {
    GetExecutionContext((cmListFileContext *)local_1a8,this);
    std::__cxx11::string::operator=((string *)&local_1e8,(string *)&local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_p != local_178) {
      operator_delete(local_188._M_p,local_178[0]._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  }
  if (this->CheckSystemVars == false) {
    pcVar4 = cmake::GetHomeDirectory(this->GlobalGenerator->CMakeInstance);
    std::__cxx11::string::string((string *)local_1a8,pcVar4,&local_209);
    bVar2 = cmsys::SystemTools::IsSubDirectory(&local_1e8,(string *)local_1a8);
    bVar3 = true;
    if (!bVar2) {
      pcVar4 = cmake::GetHomeOutputDirectory(this->GlobalGenerator->CMakeInstance);
      std::__cxx11::string::string((string *)&local_208,pcVar4,&local_20a);
      bVar3 = cmsys::SystemTools::IsSubDirectory(&local_1e8,&local_208);
      if (bVar3) {
        local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"/CMakeFiles","");
        bVar3 = cmsys::SystemTools::IsSubDirectory(&local_1e8,&local_1c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
        bVar3 = !bVar3;
      }
      else {
        bVar3 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
    }
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if (!bVar3) goto LAB_002e2be3;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"unused variable (",0x11);
  if (reason == (char *)0x0) {
    std::ios::clear((int)auStack_218 + (int)*(undefined8 *)(local_1a8._0_8_ + -0x18) + 0x70);
  }
  else {
    sVar5 = strlen(reason);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,reason,sVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,") \'",3);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\'",1);
  std::__cxx11::stringbuf::str();
  IssueMessage(this,AUTHOR_WARNING,&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
LAB_002e2be3:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,
                    CONCAT71(local_1e8.field_2._M_allocated_capacity._1_7_,
                             local_1e8.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void cmMakefile::LogUnused(const char* reason, const std::string& name) const
{
  if (this->WarnUnused) {
    std::string path;
    if (!this->ExecutionStatusStack.empty()) {
      path = this->GetExecutionContext().FilePath;
    } else {
      path = this->GetCurrentSourceDirectory();
      path += "/CMakeLists.txt";
    }

    if (this->CheckSystemVars ||
        cmSystemTools::IsSubDirectory(path, this->GetHomeDirectory()) ||
        (cmSystemTools::IsSubDirectory(path, this->GetHomeOutputDirectory()) &&
         !cmSystemTools::IsSubDirectory(path,
                                        cmake::GetCMakeFilesDirectory()))) {
      std::ostringstream msg;
      msg << "unused variable (" << reason << ") \'" << name << "\'";
      this->IssueMessage(cmake::AUTHOR_WARNING, msg.str());
    }
  }
}